

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::synonym(Forth *this)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  Definition *pDVar4;
  reference pcVar5;
  size_type sVar6;
  size_type sVar7;
  int __fd;
  string *dst;
  char *c;
  iterator __end5;
  iterator __begin5;
  string *__range5;
  Definition definition;
  Xt xt;
  int found;
  string currentWord;
  undefined1 local_40 [8];
  string newWord;
  CAddr caddr;
  size_t length;
  Forth *this_local;
  
  bl(this);
  word(this);
  count(this);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  newWord.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if ((ulong)uVar3 != 0) {
    dst = (string *)local_40;
    std::__cxx11::string::string((string *)dst);
    moveFromDataSpace(this,dst,newWord.field_2._12_4_,(ulong)uVar3);
    __fd = (int)dst;
    bl(this);
    word(this);
    dup(this,__fd);
    count(this);
    uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
    pop(this);
    newWord.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
    pop(this);
    if ((ulong)uVar3 != 0) {
      std::__cxx11::string::string((string *)&xt);
      moveFromDataSpace(this,(string *)&xt,newWord.field_2._12_4_,(ulong)uVar3);
      find(this);
      definition.FlagImmediate = ForthStack<unsigned_int>::getTop(&this->dStack);
      pop(this);
      if (definition.FlagImmediate == 0) {
        pop(this);
      }
      else {
        definition.FlagHidden = ForthStack<unsigned_int>::getTop(&this->dStack);
        pop(this);
        pDVar4 = getDefinition(this,definition.FlagHidden);
        Definition::Definition((Definition *)&__range5,pDVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &definition.flags,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
        __end5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &definition.flags);
        c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &definition.flags);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            (&__end5,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&c);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end5);
          cVar2 = toupper_ascii(*pcVar5);
          *pcVar5 = cVar2;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end5);
        }
        std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
        emplace_back<cppforth::Forth::Definition>(&this->definitions,(Definition *)&__range5);
        sVar6 = std::
                vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
                size(&this->definitions);
        sVar7 = std::
                vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::
                size(&this->definitions);
        pDVar4 = getDefinition(this,(int)sVar7 - 1);
        pDVar4->numberInVector = (int)sVar6 - 1;
        Definition::~Definition((Definition *)&__range5);
      }
      std::__cxx11::string::~string((string *)&xt);
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void synonym() {
			bl(); word();
			count();
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			if (length > 0) {
				std::string newWord{};
				moveFromDataSpace(newWord, caddr, length);
				bl(); word(); dup();
				count();
				length = SIZE_T(dStack.getTop()); pop();
				caddr = CADDR(dStack.getTop()); pop();
				if (length > 0) {
					std::string currentWord{};
					moveFromDataSpace(currentWord, caddr, length);
					find();
					auto found = static_cast<int>(dStack.getTop()); pop();
					if (found) {
						auto xt = XT(dStack.getTop()); pop();
						auto definition = *getDefinition(xt);
						definition.name = newWord;
						for (auto & c: definition.name) c = toupper_ascii(static_cast<unsigned char>(c));
						definitions.emplace_back(std::move(definition));
						getDefinition(CELL(definitions.size()) - 1)->numberInVector = CELL(definitions.size()) - 1;
					}
					else {
						pop(); // remove from stack. not found , ambigous state
					}
				}

			}
		}